

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftglyph.c
# Opt level: O0

void FT_Done_Glyph(FT_Glyph glyph)

{
  FT_Memory memory_00;
  FT_Glyph_Class *clazz;
  FT_Memory memory;
  FT_Glyph glyph_local;
  
  if (glyph != (FT_Glyph)0x0) {
    memory_00 = glyph->library->memory;
    if (glyph->clazz->glyph_done != (FT_Glyph_DoneFunc)0x0) {
      (*glyph->clazz->glyph_done)(glyph);
    }
    ft_mem_free(memory_00,glyph);
  }
  return;
}

Assistant:

FT_EXPORT_DEF( void )
  FT_Done_Glyph( FT_Glyph  glyph )
  {
    if ( glyph )
    {
      FT_Memory              memory = glyph->library->memory;
      const FT_Glyph_Class*  clazz  = glyph->clazz;


      if ( clazz->glyph_done )
        clazz->glyph_done( glyph );

      FT_FREE( glyph );
    }
  }